

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void>_>
         *this)

{
  FloatFormat *fmt;
  _Rb_tree_header *p_Var1;
  double *pdVar2;
  Precision PVar3;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  TestLog *pTVar4;
  Statement *pSVar5;
  ShaderExecutor *pSVar6;
  int iVar7;
  MessageBuilder *pMVar8;
  _Base_ptr p_Var9;
  IVal *pIVar10;
  IVal *pIVar11;
  IVal *value;
  IVal *ival;
  long lVar12;
  size_t sVar13;
  ostringstream *this_01;
  bool bVar14;
  byte bVar15;
  deUint32 in_stack_fffffffffffffa78;
  IVal reference1;
  int numErrors;
  size_t local_560;
  long local_558;
  long local_550;
  long local_548;
  IVal in2;
  FuncSet funcs;
  Environment env;
  FloatFormat highpFmt;
  void *outputArr [2];
  void *inputArr [4];
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void>_>
  outputs;
  IVal in3;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  IVal reference0;
  ResultCollector status;
  ostringstream oss;
  
  bVar15 = 0;
  this_00 = this->m_samplings;
  fmt = &(this->m_caseCtx).floatFormat;
  PVar3 = (this->m_caseCtx).precision;
  sVar13 = (this->m_caseCtx).numRandoms;
  iVar7 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,tcu::Vector<float,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&inputs,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)fmt,(FloatFormat *)(ulong)PVar3,(Precision)sVar13,(ulong)(iVar7 + 0xdeadbeef),
             in_stack_fffffffffffffa78);
  local_560 = (long)inputs.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)inputs.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void>_>::
  Outputs(&outputs,local_560);
  highpFmt.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  highpFmt.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  highpFmt.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  highpFmt.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  highpFmt.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  highpFmt.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  highpFmt.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  highpFmt.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  highpFmt._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  numErrors = 0;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &env.m_map._M_t._M_impl.super__Rb_tree_header._M_header;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&status);
  pTVar4 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  inputArr[0] = inputs.in0.
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
  inputArr[1] = inputs.in1.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
  inputArr[2] = inputs.in2.
                super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  inputArr[3] = inputs.in3.
                super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  outputArr[0] = outputs.out0.
                 super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  outputArr[1] = outputs.out1.
                 super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pdVar2 = &reference0.m_data.m_data[0].m_data[0].m_lo;
  reference0.m_data.m_data[0].m_data[0]._0_8_ = pTVar4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
  std::operator<<((ostream *)pdVar2,"Statement: ");
  pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)&reference0,&this->m_stmt);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  p_Var1 = &funcs._M_t._M_impl.super__Rb_tree_header;
  funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  funcs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pSVar5 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (*pSVar5->_vptr_Statement[4])(pSVar5,&funcs);
  for (p_Var9 = funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != p_Var1; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
    (**(code **)(**(long **)(p_Var9 + 1) + 0x30))(*(long **)(p_Var9 + 1),&oss);
  }
  if (funcs._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    pdVar2 = &reference0.m_data.m_data[0].m_data[0].m_lo;
    reference0.m_data.m_data[0].m_data[0]._0_8_ = pTVar4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
    std::operator<<((ostream *)pdVar2,"Reference definitions:\n");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)pdVar2,(string *)&in2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&reference0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&in2);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree(&funcs._M_t);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  pSVar6 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  ival = (IVal *)outputArr;
  (*pSVar6->_vptr_ShaderExecutor[2])(pSVar6,local_560,inputArr,ival,0);
  tcu::Vector<tcu::Interval,_2>::Vector((Vector<tcu::Interval,_2> *)&funcs);
  tcu::Vector<tcu::Interval,_4>::Vector((Vector<tcu::Interval,_4> *)&oss);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix(&reference0);
  Environment::bind<tcu::Vector<float,2>>
            (&env,(this->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                  m_ptr,(IVal *)&funcs);
  Environment::bind<tcu::Vector<float,4>>
            (&env,(this->m_variables).in1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                  m_ptr,(IVal *)&oss);
  Environment::bind<vkt::shaderexecutor::Void>
            (&env,(this->m_variables).in2.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                  m_ptr,&in2);
  Environment::bind<vkt::shaderexecutor::Void>
            (&env,(this->m_variables).in3.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                  m_ptr,&in3);
  Environment::bind<tcu::Matrix<float,2,4>>
            (&env,(this->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.
                  m_ptr,&reference0);
  Environment::bind<vkt::shaderexecutor::Void>
            (&env,(this->m_variables).out1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                  m_ptr,&reference1);
  local_548 = 0;
  pdVar2 = &reference0.m_data.m_data[0].m_data[0].m_lo;
  local_550 = 0;
  local_558 = 0;
  iVar7 = 0;
  sVar13 = local_560;
  while (bVar14 = sVar13 != 0, sVar13 = sVar13 - 1, bVar14) {
    tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)&oss);
    round<tcu::Vector<float,2>>
              ((IVal *)&funcs,(shaderexecutor *)fmt,
               (FloatFormat *)
               ((long)(inputs.in0.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + local_548),
               (Vector<float,_2> *)ival);
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
              ((IVal *)&reference0,fmt,(IVal *)&funcs);
    pIVar10 = Environment::lookup<tcu::Vector<float,2>>
                        (&env,(this->m_variables).in0.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                              .m_ptr);
    pIVar10->m_data[1].m_lo = reference0.m_data.m_data[0].m_data[1].m_lo;
    pIVar10->m_data[1].m_hi =
         (double)CONCAT44(reference0.m_data.m_data[0].m_data[1].m_hi._4_4_,
                          reference0.m_data.m_data[0].m_data[1].m_hi._0_4_);
    pIVar10->m_data[0].m_hi =
         (double)CONCAT44(reference0.m_data.m_data[0].m_data[0].m_hi._4_4_,
                          reference0.m_data.m_data[0].m_data[0].m_hi._0_4_);
    *(ulong *)(pIVar10->m_data + 1) =
         CONCAT44(reference0.m_data.m_data[0].m_data[1]._4_4_,
                  reference0.m_data.m_data[0].m_data[1]._0_4_);
    pIVar10->m_data[0].m_hasNaN = reference0.m_data.m_data[0].m_data[0].m_hasNaN;
    *(undefined7 *)&pIVar10->m_data[0].field_0x1 = reference0.m_data.m_data[0].m_data[0]._1_7_;
    pIVar10->m_data[0].m_lo =
         (double)CONCAT44(reference0.m_data.m_data[0].m_data[0].m_lo._4_4_,
                          reference0.m_data.m_data[0].m_data[0].m_lo._0_4_);
    round<tcu::Vector<float,4>>
              ((IVal *)&funcs,(shaderexecutor *)fmt,
               (FloatFormat *)
               ((long)(inputs.in1.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + local_550),
               (Vector<float,_4> *)ival);
    ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
              ((IVal *)&reference0,fmt,(IVal *)&funcs);
    pIVar11 = Environment::lookup<tcu::Vector<float,4>>
                        (&env,(this->m_variables).in1.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                              .m_ptr);
    pMVar8 = (MessageBuilder *)&reference0;
    for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
      *(TestLog **)pIVar11->m_data = pMVar8->m_log;
      pMVar8 = (MessageBuilder *)((long)pMVar8 + (ulong)bVar15 * -0x10 + 8);
      pIVar11 = (IVal *)((long)pIVar11 + ((ulong)bVar15 * -2 + 1) * 8);
    }
    Environment::lookup<vkt::shaderexecutor::Void>
              (&env,(this->m_variables).in2.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                    .m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              (&env,(this->m_variables).in3.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                    .m_ptr);
    reference0.m_data.m_data[0].m_data[1].m_hi._0_4_ = (this->m_caseCtx).precision;
    ival = (IVal *)(this->m_caseCtx).floatFormat.m_maxValue;
    reference0.m_data.m_data[0].m_data[0]._0_8_ = *(undefined8 *)fmt;
    reference0.m_data.m_data[0].m_data[0].m_lo._0_4_ = (this->m_caseCtx).floatFormat.m_fractionBits;
    reference0.m_data.m_data[0].m_data[0].m_lo._4_4_ = (this->m_caseCtx).floatFormat.m_hasSubnormal;
    reference0.m_data.m_data[0].m_data[0].m_hi._0_4_ = (this->m_caseCtx).floatFormat.m_hasInf;
    reference0.m_data.m_data[0].m_data[0].m_hi._4_4_ = (this->m_caseCtx).floatFormat.m_hasNaN;
    reference0.m_data.m_data[0].m_data[1].m_hasNaN = (this->m_caseCtx).floatFormat.m_exactPrecision;
    reference0.m_data.m_data[0].m_data[1]._1_3_ =
         *(undefined3 *)&(this->m_caseCtx).floatFormat.field_0x19;
    reference0.m_data.m_data[0].m_data[1]._4_4_ =
         *(undefined4 *)&(this->m_caseCtx).floatFormat.field_0x1c;
    reference0.m_data.m_data[1].m_data[0].m_lo._0_4_ = 0;
    pSVar5 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
    reference0.m_data.m_data[0].m_data[1].m_lo = (double)ival;
    reference0.m_data.m_data[1].m_data[0]._0_8_ = &env;
    (*pSVar5->_vptr_Statement[3])(pSVar5,(MessageBuilder *)&reference0);
    value = Environment::lookup<tcu::Matrix<float,2,4>>
                      (&env,(this->m_variables).out0.
                            super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>
                            .m_ptr);
    ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
              (&reference0,&highpFmt,value);
    tcu::Matrix<tcu::Interval,_2,_4>::operator=
              ((Matrix<tcu::Interval,_2,_4> *)&oss,(Matrix<tcu::Interval,_2,_4> *)&reference0);
    bVar14 = ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::
             doContains((IVal *)&oss,
                        (Matrix<float,_2,_4> *)
                        ((long)((outputs.out0.
                                 super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].
                               m_data + local_558));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reference0,"Shader output 0 is outside acceptable range",
               (allocator<char> *)&funcs);
    bVar14 = tcu::ResultCollector::check(&status,bVar14,(string *)&reference0);
    std::__cxx11::string::~string((string *)&reference0);
    if ((!bVar14) && (iVar7 = iVar7 + 1, numErrors = iVar7, iVar7 < 0x65)) {
      reference0.m_data.m_data[0].m_data[0]._0_8_ = pTVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
      std::operator<<((ostream *)pdVar2,"Failed");
      std::operator<<((ostream *)pdVar2," sample:\n");
      std::operator<<((ostream *)pdVar2,"\t");
      std::__cxx11::string::string
                ((string *)&funcs,
                 (string *)
                 &((this->m_variables).in0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                  m_ptr)->m_name);
      std::operator<<((ostream *)pdVar2,(string *)&funcs);
      std::operator<<((ostream *)pdVar2," = ");
      valueToString<tcu::Vector<float,2>>
                ((string *)&in2,(shaderexecutor *)&highpFmt,
                 (FloatFormat *)
                 ((long)(inputs.in0.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + local_548),
                 (Vector<float,_2> *)ival);
      std::operator<<((ostream *)pdVar2,(string *)&in2);
      std::operator<<((ostream *)pdVar2,"\n");
      std::__cxx11::string::~string((string *)&in2);
      std::__cxx11::string::~string((string *)&funcs);
      std::operator<<((ostream *)pdVar2,"\t");
      std::__cxx11::string::string
                ((string *)&funcs,
                 (string *)
                 &((this->m_variables).in1.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                  m_ptr)->m_name);
      std::operator<<((ostream *)pdVar2,(string *)&funcs);
      std::operator<<((ostream *)pdVar2," = ");
      valueToString<tcu::Vector<float,4>>
                ((string *)&in2,(shaderexecutor *)&highpFmt,
                 (FloatFormat *)
                 ((long)(inputs.in1.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + local_550),
                 (Vector<float,_4> *)ival);
      std::operator<<((ostream *)pdVar2,(string *)&in2);
      std::operator<<((ostream *)pdVar2,"\n");
      std::__cxx11::string::~string((string *)&in2);
      std::__cxx11::string::~string((string *)&funcs);
      std::operator<<((ostream *)pdVar2,"\t");
      std::__cxx11::string::string
                ((string *)&funcs,
                 (string *)
                 &((this->m_variables).out0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_4>_>_>.
                  m_ptr)->m_name);
      std::operator<<((ostream *)pdVar2,(string *)&funcs);
      std::operator<<((ostream *)pdVar2," = ");
      valueToString<tcu::Matrix<float,2,4>>
                ((string *)&in2,(shaderexecutor *)&highpFmt,
                 (FloatFormat *)
                 ((long)((outputs.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                 local_558),(Matrix<float,_2,_4> *)ival);
      std::operator<<((ostream *)pdVar2,(string *)&in2);
      std::operator<<((ostream *)pdVar2,"\n");
      std::operator<<((ostream *)pdVar2,"\tExpected range: ");
      intervalToString<tcu::Matrix<float,2,4>>
                ((string *)&in3,(shaderexecutor *)&highpFmt,(FloatFormat *)&oss,ival);
      std::operator<<((ostream *)pdVar2,(string *)&in3);
      std::operator<<((ostream *)pdVar2,"\n");
      std::__cxx11::string::~string((string *)&in3);
      std::__cxx11::string::~string((string *)&in2);
      std::__cxx11::string::~string((string *)&funcs);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&reference0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
    }
    local_558 = local_558 + 0x20;
    local_550 = local_550 + 0x10;
    local_548 = local_548 + 8;
  }
  if (iVar7 < 0x65) {
    if (iVar7 == 0) {
      pdVar2 = &reference0.m_data.m_data[0].m_data[0].m_lo;
      reference0.m_data.m_data[0].m_data[0]._0_8_ = pTVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
      std::operator<<((ostream *)pdVar2,"All ");
      std::ostream::_M_insert<unsigned_long>((ulong)pdVar2);
      std::operator<<((ostream *)pdVar2," inputs passed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&reference0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&reference0,"Pass",(allocator<char> *)&oss);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)&reference0);
      this_01 = (ostringstream *)&reference0;
      goto LAB_0083ad32;
    }
  }
  else {
    pdVar2 = &reference0.m_data.m_data[0].m_data[0].m_lo;
    reference0.m_data.m_data[0].m_data[0]._0_8_ = pTVar4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
    std::operator<<((ostream *)pdVar2,"(Skipped ");
    std::ostream::operator<<(pdVar2,iVar7 + -100);
    std::operator<<((ostream *)pdVar2," messages.)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&reference0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
  }
  pdVar2 = &reference0.m_data.m_data[0].m_data[0].m_lo;
  reference0.m_data.m_data[0].m_data[0]._0_8_ = pTVar4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
  std::ostream::operator<<(pdVar2,iVar7);
  std::operator<<((ostream *)pdVar2,"/");
  std::ostream::_M_insert<unsigned_long>((ulong)pdVar2);
  std::operator<<((ostream *)pdVar2," inputs failed.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&reference0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
  de::toString<int>((string *)&oss,&numErrors);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs," test failed. Check log for the details",(allocator<char> *)&in2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reference0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs);
  tcu::TestStatus::fail(__return_storage_ptr__,(string *)&reference0);
  std::__cxx11::string::~string((string *)&reference0);
  std::__cxx11::string::~string((string *)&funcs);
  this_01 = &oss;
LAB_0083ad32:
  std::__cxx11::string::~string((string *)this_01);
  tcu::ResultCollector::~ResultCollector(&status);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
               *)&env);
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_4>,_vkt::shaderexecutor::Void>_>::
  ~Outputs(&outputs);
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::~Inputs(&inputs);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}